

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O2

string * __thiscall
cornelich::cycle_formatter_yyyymmddhh::date_from_cycle_impl_abi_cxx11_
          (string *__return_storage_ptr__,cycle_formatter_yyyymmddhh *this,int64_t cycle)

{
  year_month_day yVar1;
  long lVar2;
  long lVar3;
  uint local_118;
  uint local_114;
  int local_110;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
  daypoint;
  rep_conflict local_108;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sink;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_c8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_b8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_a8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_98;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_88;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_78;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_68;
  time_of_day<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tod;
  
  lVar2 = (this->super_cycle_formatter).m_cycle_length * cycle;
  lVar3 = (lVar2 / 1000) * 1000000000;
  lVar2 = lVar2 / 86400000;
  daypoint.__d.__r = (duration)((int)lVar2 - (uint)(lVar3 < lVar2 * 86400000000000));
  yVar1 = date::year_month_day::from_day_point(&daypoint);
  date::detail::
  time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
  ::time_of_day_storage
            (&tod.
              super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
             ,(precision)((long)(int)daypoint.__d.__r * -86400000000000 + lVar3));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_98.child0 = &that;
  that.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<0UL,_int>.elem = 4;
  that.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<1UL,_char>.elem = '0';
  local_88.child0 = &local_98;
  local_98.child1 = (proto_child1)&boost::spirit::int_;
  local_a8.child0 = &that_1;
  that_3.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<0UL,_int>.elem = 2;
  that_1.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<1UL,_char>.elem = '0';
  local_88.child1 = &local_a8;
  local_a8.child1 = (proto_child1)&boost::spirit::uint_;
  local_78.child0 = &local_88;
  local_b8.child0 = &that_2;
  that_2.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<1UL,_char>.elem = '0';
  local_78.child1 = &local_b8;
  local_b8.child1 = (proto_child1)&boost::spirit::uint_;
  local_68.child0 = &local_78;
  local_c8.child0 = &that_3;
  that_3.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<1UL,_char>.elem = '0';
  local_68.child1 = &local_c8;
  local_c8.child1 = (proto_child1)&boost::spirit::uint_;
  local_110 = (int)yVar1.y_.y_.y_;
  local_114 = (uint)yVar1 >> 0x10 & 0xff;
  local_108 = tod.
              super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
              .super_time_of_day_base.h_.__r;
  local_118 = (uint)yVar1 >> 0x18;
  sink.container = __return_storage_ptr__;
  that_2.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<0UL,_int>.elem =
       that_3.child0.args.
       super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
       super_store<0UL,_int>.elem;
  that_1.child0.args.super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
  super_store<0UL,_int>.elem =
       that_3.child0.args.
       super_vector_data<boost::fusion::detail::index_sequence<0UL,_1UL>,_int,_char>.
       super_store<0UL,_int>.elem;
  boost::spirit::karma::
  generate<std::back_insert_iterator<std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>,int,unsigned_int,unsigned_int,long>
            (&sink,&local_68,&local_110,&local_114,&local_118,&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string cycle_formatter_yyyymmddhh::date_from_cycle_impl(std::int64_t cycle) const
{
    const auto s = static_cast<std::time_t>(cycle * m_cycle_length / 1000);
    auto ts = system_clock::time_point(seconds(s));
    auto daypoint = floor<days>(ts);
    auto ymd = year_month_day(daypoint);
    auto tod = make_time(ts - daypoint);

    using namespace boost::spirit;

    std::string result;
    std::back_insert_iterator<std::string> sink(result);
    karma::generate(sink,
                    karma::right_align(4, '0')[karma::int_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_],
            int(ymd.year()), unsigned(ymd.month()), unsigned(ymd.day()), tod.hours().count());
    return result;
}